

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedBreakIterator::setText(RuleBasedBreakIterator *this,UnicodeString *newText)

{
  StringCharacterIterator *this_00;
  CharacterIterator *pCVar1;
  UErrorCode status;
  UErrorCode local_1c;
  
  local_1c = U_ZERO_ERROR;
  BreakCache::reset(this->fBreakCache,0,0);
  DictionaryCache::reset(this->fDictionaryCache);
  utext_openConstUnicodeString_63(&this->fText,newText,&local_1c);
  this_00 = &this->fSCharIter;
  StringCharacterIterator::setText(this_00,newText);
  pCVar1 = this->fCharIter;
  if (pCVar1 != (CharacterIterator *)0x0 && (StringCharacterIterator *)pCVar1 != this_00) {
    (*(pCVar1->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
  }
  this->fCharIter = (CharacterIterator *)this_00;
  (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])(this);
  return;
}

Assistant:

void
RuleBasedBreakIterator::setText(const UnicodeString& newText) {
    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->reset();
    fDictionaryCache->reset();
    utext_openConstUnicodeString(&fText, &newText, &status);

    // Set up a character iterator on the string.
    //   Needed in case someone calls getText().
    //  Can not, unfortunately, do this lazily on the (probably never)
    //  call to getText(), because getText is const.
    fSCharIter.setText(newText);

    if (fCharIter != &fSCharIter) {
        // old fCharIter was adopted from the outside.  Delete it.
        delete fCharIter;
    }
    fCharIter = &fSCharIter;

    this->first();
}